

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_EqString_Test<char>::Body
          (iu_StrCaseTest_x_iutest_x_EqString_Test<char> *this)

{
  AssertionResult iutest_ar;
  String test2;
  String test1;
  AssertionResult local_228;
  iuCodeMessage local_200;
  char *local_1d0 [4];
  char *local_1b0 [4];
  Fixed local_190;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,text<char>::test,(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d0,text<char>::test,(allocator<char> *)&local_190);
  iutest::internal::CmpHelperSTRCASEEQ
            (&local_228,"test1","TestFixture::Text::test",local_1b0[0],text<char>::test);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xc6,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASEEQ(&local_228,"test1","test2",local_1b0[0],local_1d0[0]);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,199,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASEEQ
            (&local_228,"TestFixture::Text::test","test2",text<char>::test,local_1d0[0]);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,200,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASEEQ
            (&local_228,"test1","TestFixture::Text::test",local_1b0[0],text<char>::test);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xca,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASEEQ(&local_228,"test1","test2",local_1b0[0],local_1d0[0]);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xcb,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASEEQ
            (&local_228,"TestFixture::Text::test","test2",text<char>::test,local_1d0[0]);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xcc,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_228);
  iutest::internal::CmpHelperSTRCASEEQ
            (&local_228,"test1","TestFixture::Text::test",local_1b0[0],text<char>::test);
  if (local_228.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xce,local_228.m_message._M_dataplus._M_p);
    local_200._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&local_228);
    iutest::internal::CmpHelperSTRCASEEQ(&local_228,"test1","test2",local_1b0[0],local_1d0[0]);
    if (local_228.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xcf,local_228.m_message._M_dataplus._M_p);
      local_200._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    }
    else {
      std::__cxx11::string::~string((string *)&local_228);
      iutest::internal::CmpHelperSTRCASEEQ
                (&local_228,"TestFixture::Text::test","test2",text<char>::test,local_1d0[0]);
      if (local_228.m_result != false) goto LAB_002dc3ec;
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xd0,local_228.m_message._M_dataplus._M_p);
      local_200._44_4_ = 2;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,&local_190);
    }
  }
  std::__cxx11::string::~string((string *)&local_200);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002dc3ec:
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1b0);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, EqString)
{
    typename TestFixture::String test1 = TestFixture::Text::test;
    typename TestFixture::String test2 = TestFixture::Text::test;
    IUTEST_INFORM_STRCASEEQ(test1, TestFixture::Text::test);
    IUTEST_INFORM_STRCASEEQ(test1, test2);
    IUTEST_INFORM_STRCASEEQ(TestFixture::Text::test, test2);

    IUTEST_EXPECT_STRCASEEQ(test1, TestFixture::Text::test);
    IUTEST_EXPECT_STRCASEEQ(test1, test2);
    IUTEST_EXPECT_STRCASEEQ(TestFixture::Text::test, test2);

    IUTEST_ASSERT_STRCASEEQ(test1, TestFixture::Text::test);
    IUTEST_ASSERT_STRCASEEQ(test1, test2);
    IUTEST_ASSERT_STRCASEEQ(TestFixture::Text::test, test2);
}